

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_math.c
# Opt level: O0

int lj_cf_math_random(lua_State *L)

{
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  long in_RDI;
  lua_State *L_00;
  lua_Number lVar5;
  double r2;
  double r1;
  double d;
  U64double u;
  RandomState *rs;
  int n;
  undefined8 in_stack_ffffffffffffffc8;
  int narg;
  lua_State *in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  RandomState *in_stack_ffffffffffffffe0;
  
  iVar2 = (int)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) >> 3);
  uVar3 = (ulong)*(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 0x20);
  if (*(int *)(uVar3 + 0x38) == 0) {
    random_init(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  dVar4 = (double)lj_math_random_step((RandomState *)(uVar3 + 0x18));
  dVar4 = dVar4 - 1.0;
  if (0 < iVar2) {
    narg = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    L_00 = (lua_State *)lj_lib_checknum(in_stack_ffffffffffffffd0,narg);
    if (iVar2 == 1) {
      dVar4 = floor(dVar4 * (double)L_00);
      dVar4 = dVar4 + 1.0;
    }
    else {
      lVar5 = lj_lib_checknum(L_00,narg);
      dVar4 = floor(dVar4 * ((lVar5 - (double)L_00) + 1.0));
      dVar4 = dVar4 + (double)L_00;
    }
  }
  pdVar1 = *(double **)(in_RDI + 0x18);
  *(double **)(in_RDI + 0x18) = pdVar1 + 1;
  *pdVar1 = dVar4;
  return 1;
}

Assistant:

LJLIB_CF(math_random)		LJLIB_REC(.)
{
  int n = (int)(L->top - L->base);
  RandomState *rs = (RandomState *)(uddata(udataV(lj_lib_upvalue(L, 1))));
  U64double u;
  double d;
  if (LJ_UNLIKELY(!rs->valid)) random_init(rs, 0.0);
  u.u64 = lj_math_random_step(rs);
  d = u.d - 1.0;
  if (n > 0) {
#if LJ_DUALNUM
    int isint = 1;
    double r1;
    lj_lib_checknumber(L, 1);
    if (tvisint(L->base)) {
      r1 = (lua_Number)intV(L->base);
    } else {
      isint = 0;
      r1 = numV(L->base);
    }
#else
    double r1 = lj_lib_checknum(L, 1);
#endif
    if (n == 1) {
      d = lj_vm_floor(d*r1) + 1.0;  /* d is an int in range [1, r1] */
    } else {
#if LJ_DUALNUM
      double r2;
      lj_lib_checknumber(L, 2);
      if (tvisint(L->base+1)) {
	r2 = (lua_Number)intV(L->base+1);
      } else {
	isint = 0;
	r2 = numV(L->base+1);
      }
#else
      double r2 = lj_lib_checknum(L, 2);
#endif
      d = lj_vm_floor(d*(r2-r1+1.0)) + r1;  /* d is an int in range [r1, r2] */
    }
#if LJ_DUALNUM
    if (isint) {
      setintV(L->top-1, lj_num2int(d));
      return 1;
    }
#endif
  }  /* else: d is a double in range [0, 1] */
  setnumV(L->top++, d);
  return 1;
}